

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

void bn_correct_top(BIGNUM *a)

{
  int tmp_top;
  unsigned_long *ftl;
  BIGNUM *a_local;
  
  tmp_top = a->top;
  if (0 < tmp_top) {
    ftl = a->d + tmp_top;
    while ((0 < tmp_top && (ftl = ftl + -1, *ftl == 0))) {
      tmp_top = tmp_top + -1;
    }
    a->top = tmp_top;
  }
  if (a->top == 0) {
    a->neg = 0;
  }
  return;
}

Assistant:

void bn_correct_top(BIGNUM *a)
{
    BN_ULONG *ftl;
    int tmp_top = a->top;

    if (tmp_top > 0) {
        for (ftl = &(a->d[tmp_top]); tmp_top > 0; tmp_top--) {
            ftl--;
            if (*ftl != 0)
                break;
        }
        a->top = tmp_top;
    }
    if (a->top == 0)
        a->neg = 0;
    bn_pollute(a);
}